

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

void mpi_sub_hlp(size_t n,mbedtls_mpi_uint *s,mbedtls_mpi_uint *d)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  
  if (n == 0) {
    uVar2 = 0;
  }
  else {
    lVar3 = 0;
    uVar2 = 0;
    sVar4 = 0;
    do {
      uVar1 = d[sVar4];
      uVar5 = uVar1 - uVar2;
      d[sVar4] = uVar5;
      uVar2 = (ulong)(uVar5 < s[sVar4]) + (ulong)(uVar1 < uVar2);
      d[sVar4] = uVar5 - s[sVar4];
      sVar4 = sVar4 + 1;
      lVar3 = lVar3 + -8;
    } while (n != sVar4);
    d = (mbedtls_mpi_uint *)((long)d - lVar3);
  }
  if (uVar2 != 0) {
    do {
      bVar6 = *d < uVar2;
      *d = *d - uVar2;
      d = d + 1;
      uVar2 = (ulong)bVar6;
    } while (bVar6);
  }
  return;
}

Assistant:

static void mpi_sub_hlp( size_t n, mbedtls_mpi_uint *s, mbedtls_mpi_uint *d )
{
    size_t i;
    mbedtls_mpi_uint c, z;

    for( i = c = 0; i < n; i++, s++, d++ )
    {
        z = ( *d <  c );     *d -=  c;
        c = ( *d < *s ) + z; *d -= *s;
    }

    while( c != 0 )
    {
        z = ( *d < c ); *d -= c;
        c = z; d++;
    }
}